

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTexture.cpp
# Opt level: O0

bool __thiscall
sf::RenderTexture::create(RenderTexture *this,uint width,uint height,bool depthBuffer)

{
  uint depth;
  byte bVar1;
  bool bVar2;
  byte in_CL;
  ContextSettings *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_CL & 1;
  depth = 0;
  if (bVar1 != 0) {
    depth = 0x20;
  }
  ContextSettings::ContextSettings
            ((ContextSettings *)&stack0xffffffffffffffd0,depth,0,0,1,1,0,false);
  bVar2 = create((RenderTexture *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                 in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return bVar2;
}

Assistant:

bool RenderTexture::create(unsigned int width, unsigned int height, bool depthBuffer)
{
    return create(width, height, ContextSettings(depthBuffer ? 32 : 0));
}